

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

void rcg::convYCbCr411toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int j;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  undefined1 uVar8;
  ulong local_18;
  ulong local_10;
  
  lVar3 = (long)(i >> 2);
  local_18 = (ulong)CONCAT14((char)(*(ushort *)(row + lVar3 * 6) >> 8),
                             (uint)(*(ushort *)(row + lVar3 * 6) & 0xff));
  uVar8 = (undefined1)((ushort)*(undefined2 *)(row + lVar3 * 6 + 3) >> 8);
  local_10 = (ulong)(CONCAT14(uVar8,(uint)CONCAT12(uVar8,*(undefined2 *)(row + lVar3 * 6 + 3))) &
                    0xffffff00ff) & 0xffffffff0000ffff;
  bVar1 = row[lVar3 * 6 + 2];
  bVar2 = row[lVar3 * 6 + 5];
  lVar3 = 0;
  do {
    iVar6 = *(int *)((long)&local_18 + lVar3 * 4);
    iVar7 = (((uint)bVar2 * 0x5a + 0x1320 >> 6) - 0x100) + iVar6;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    iVar4 = (((uint)bVar2 * -0x2e + (uint)bVar1 * -0x16 + 0x6220 >> 6) - 0x100) + iVar6;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    *rgb = (uint8_t)iVar7;
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    iVar6 = iVar6 + (((uint)bVar1 * 0x71 + 0x7a0 >> 6) - 0x100);
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    rgb[1] = (uint8_t)iVar4;
    uVar5 = (uint8_t)iVar6;
    if (0xfe < iVar6) {
      uVar5 = 0xff;
    }
    rgb[2] = uVar5;
    rgb = rgb + 3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void convYCbCr411toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*6;

  const int Y[4]={row[i], row[i+1], row[i+3], row[i+4]};
  const int Cb=static_cast<int>(row[i+2])-128;
  const int Cr=static_cast<int>(row[i+5])-128;

  // conversion of YCbCr into RGB with correct rounding
  const int rc=((90*Cr+16384+32)>>6)-256;
  const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
  const int bc=((113*Cb+16384+32)>>6)-256;

  for (int j=0; j<4; j++)
  {
    *rgb++=clamp8(Y[j]+rc);
    *rgb++=clamp8(Y[j]+gc);
    *rgb++=clamp8(Y[j]+bc);
  }
}